

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O2

shared_ptr<kratos::Var> __thiscall kratos::Var::as<kratos::Var>(Var *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<kratos::Var> sVar1;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            (local_28,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x68));
  std::static_pointer_cast<kratos::Var,kratos::Var>((shared_ptr<kratos::Var> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::Var>)sVar1.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as() {
        return std::static_pointer_cast<T>(shared_from_this());
    }